

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_2dVector::Unitize(ON_2dVector *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  ON_2dVector OVar5;
  ON_2dVector local_28;
  
  dVar2 = Length(this);
  if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
    if (2.2250738585072014e-308 < dVar2) {
      OVar5 = *this;
LAB_00587196:
      auVar1._8_8_ = dVar2;
      auVar1._0_8_ = dVar2;
      OVar5 = (ON_2dVector)divpd((undefined1  [16])OVar5,auVar1);
      *this = OVar5;
      return true;
    }
    if (0.0 < dVar2) {
      dVar3 = this->x * 8.98846567431158e+307;
      dVar4 = this->y * 8.98846567431158e+307;
      local_28.x = dVar3;
      local_28.y = dVar4;
      dVar2 = Length(&local_28);
      if (2.2250738585072014e-308 < dVar2 && (ulong)ABS(dVar2) < 0x7ff0000000000000) {
        OVar5.y = dVar4;
        OVar5.x = dVar3;
        goto LAB_00587196;
      }
    }
  }
  this->x = 0.0;
  this->y = 0.0;
  return false;
}

Assistant:

bool ON_2dVector::Unitize()
{
  // 15 September 2003 Dale Lear
  //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_2dVector::Length()
  //     for details.
  double d = Length();
  if ( ON_IS_FINITE(d) )
  {
    if ( d > ON_DBL_MIN ) 
    {
      x /= d;
      y /= d;
      return true;
    }
    
    if ( d > 0.0 )
    {
      // This code is rarely used and can be slow.
      // It multiplies by 2^1023 in an attempt to 
      // normalize the coordinates.
      // If the renormalization works, then we're
      // ok.  If the renormalization fails, we
      // return false.
      ON_2dVector tmp;
      tmp.x = x*8.9884656743115795386465259539451e+307;
      tmp.y = y*8.9884656743115795386465259539451e+307;
      d = tmp.Length();
      if ( ON_IS_FINITE(d) && d > ON_DBL_MIN )
      {
        x = tmp.x/d;
        y = tmp.y/d;
        return true;
      }
    }
  }

  x = 0.0;
  y = 0.0;

  return false;
}